

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O0

RPCHelpMan * wallet::getunconfirmedbalance(void)

{
  long lVar1;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  RPCMethodImpl *in_stack_00000010;
  RPCExamples *in_stack_fffffffffffffda8;
  RPCResult *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffffdb0;
  RPCResult *this_00;
  RPCHelpMan *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined1 in_stack_fffffffffffffe0f;
  RPCHelpMan *inner;
  string *in_stack_fffffffffffffe18;
  RPCResult *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  Type in_stack_fffffffffffffe2c;
  RPCResult *in_stack_fffffffffffffe30;
  allocator<char> local_1b9;
  pointer local_1b8;
  pointer pRStack_1b0;
  pointer local_1a8;
  allocator<char> local_192;
  allocator<char> local_191 [25];
  _Alloc_hider local_178;
  size_type sStack_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  allocator<char> local_152;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_151 [2];
  RPCExamples *in_stack_fffffffffffffef0;
  RPCResults *in_stack_fffffffffffffef8;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  string *in_stack_ffffffffffffff10;
  RPCHelpMan *in_stack_ffffffffffffff18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = local_151;
  __s = in_RDI;
  inner = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,(allocator<char> *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,(allocator<char> *)in_RDI);
  local_178._M_p = (pointer)0x0;
  sStack_170 = 0;
  local_168._M_allocated_capacity = 0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffda8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,(allocator<char> *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,(allocator<char> *)in_RDI);
  local_1b8 = (pointer)0x0;
  pRStack_1b0 = (pointer)0x0;
  local_1a8 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffda8);
  RPCResult::RPCResult
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,(string *)in_stack_fffffffffffffe20
             ,in_stack_fffffffffffffe18,(vector<RPCResult,_std::allocator<RPCResult>_> *)inner,
             (bool)in_stack_fffffffffffffe0f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
             in_stack_fffffffffffffe20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,(allocator<char> *)in_RDI);
  RPCExamples::RPCExamples(in_stack_fffffffffffffda8,(string *)0x535674);
  this = (RPCResult *)&stack0xfffffffffffffe20;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::getunconfirmedbalance()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this,
             in_stack_fffffffffffffdb0);
  this_00 = this;
  RPCHelpMan::RPCHelpMan
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
             in_stack_00000010);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_1b9);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult(this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_192);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_191);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_152);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)local_151);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __s;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan getunconfirmedbalance()
{
    return RPCHelpMan{"getunconfirmedbalance",
                "DEPRECATED\nIdentical to getbalances().mine.untrusted_pending\n",
                {},
                RPCResult{RPCResult::Type::NUM, "", "The balance"},
                RPCExamples{""},
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    pwallet->BlockUntilSyncedToCurrentChain();

    LOCK(pwallet->cs_wallet);

    return ValueFromAmount(GetBalance(*pwallet).m_mine_untrusted_pending);
},
    };
}